

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.h
# Opt level: O3

void __thiscall
gpu::BlendFilters<unsigned_char>::hardMix
          (BlendFilters<unsigned_char> *this,uchar *baseLayer,uchar *blendLayer,uchar *destination,
          float alpha)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  float fVar5;
  float fVar6;
  
  bVar1 = *blendLayer;
  if ((char)bVar1 < '\0') {
    bVar4 = *baseLayer;
    uVar3 = ((uint)bVar4 << 8) / ((uint)(ushort)bVar1 * 2 ^ 0x1ff);
    if (uVar3 < 0x100) goto LAB_00153d73;
  }
  else {
    bVar4 = *baseLayer;
    fVar6 = 0.0;
    if ((bVar1 == 0) ||
       (uVar3 = ((uint)(byte)~bVar4 << 8) / ((uint)(ushort)bVar1 * 2), iVar2 = uVar3 - 0xff,
       0xfe < uVar3 && iVar2 != 0)) goto LAB_00153d85;
    uVar3 = -iVar2;
LAB_00153d73:
    if (uVar3 < 0x80) {
      fVar6 = 0.0;
      goto LAB_00153d85;
    }
  }
  fVar6 = 255.0;
LAB_00153d85:
  fVar6 = fVar6 * alpha + (float)bVar4 * (1.0 - alpha);
  fVar5 = 255.0;
  if ((fVar6 <= 255.0) && (fVar5 = fVar6, fVar6 < 0.0)) {
    fVar5 = 0.0;
  }
  *destination = (uchar)(int)fVar5;
  return;
}

Assistant:

FUNCTION_PREFIX void BlendFilters<T>::hardMix(const T& baseLayer,const T& blendLayer, T& destination, float alpha)
    {
      float blendValue=ChannelBlend_HardMix(baseLayer,blendLayer);
      float blendValueNormalized=(1.0-alpha)*baseLayer+alpha*blendValue;
      PIXEL_DOMAIN_CHECK(blendValueNormalized);
      destination=(T)blendValueNormalized;
    }